

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int cuddSifting(DdManager *table,int lower,int upper)

{
  int iVar1;
  int iVar2;
  int local_44;
  int result;
  int x;
  int size;
  int *var;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  iVar1 = table->size;
  _x = (void *)0x0;
  entry = (int *)malloc((long)iVar1 << 2);
  if (entry == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    _x = malloc((long)iVar1 << 2);
    if (_x == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      for (var._4_4_ = 0; var._4_4_ < iVar1; var._4_4_ = var._4_4_ + 1) {
        entry[var._4_4_] = table->subtables[table->perm[var._4_4_]].keys;
        *(int *)((long)_x + (long)var._4_4_ * 4) = var._4_4_;
      }
      qsort(_x,(long)iVar1,4,ddUniqueCompare);
      var._4_4_ = 0;
      while( true ) {
        local_44 = iVar1;
        if (table->siftMaxVar <= iVar1) {
          local_44 = table->siftMaxVar;
        }
        if ((local_44 <= var._4_4_) || (table->siftMaxSwap <= ddTotalNumberSwapping)) {
          if (_x != (void *)0x0) {
            free(_x);
          }
          if (entry != (int *)0x0) {
            free(entry);
            entry = (int *)0x0;
          }
          return 1;
        }
        iVar2 = table->perm[*(int *)((long)_x + (long)var._4_4_ * 4)];
        if ((((lower <= iVar2) && (iVar2 <= upper)) && (table->subtables[iVar2].bindVar != 1)) &&
           (iVar2 = ddSiftingAux(table,iVar2,lower,upper), iVar2 == 0)) break;
        var._4_4_ = var._4_4_ + 1;
      }
    }
  }
  if ((entry != (int *)0x0) && (entry != (int *)0x0)) {
    free(entry);
    entry = (int *)0x0;
  }
  if ((_x != (void *)0x0) && (_x != (void *)0x0)) {
    free(_x);
  }
  return 0;
}

Assistant:

int
cuddSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,size,sizeof(int),(DD_QSFP)ddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];

        if (x < lower || x > upper || table->subtables[x].bindVar == 1)
            continue;
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        result = ddSiftingAux(table, x, lower, upper);
        if (!result) goto cuddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->err,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keys - table->isolated, var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1);

cuddSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}